

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

int Gia_ManCheckRefinements
              (Gia_Man_t *p,Vec_Str_t *vStatus,Vec_Int_t *vOutputs,Cec_ManSim_t *pSim,int fRings)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  iVar1 = vStatus->nSize;
  if (iVar1 * 2 != vOutputs->nSize) {
    __assert_fail("2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCorr.c"
                  ,0x268,
                  "int Gia_ManCheckRefinements(Gia_Man_t *, Vec_Str_t *, Vec_Int_t *, Cec_ManSim_t *, int)"
                 );
  }
  if (0 < iVar1) {
    uVar2 = 1;
    lVar3 = 0;
    do {
      if (((long)vOutputs->nSize <= (long)(uVar2 - 1)) || ((uint)vOutputs->nSize <= uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vStatus->pArray[lVar3] == -1) {
        Cec_ManSimClassRemoveOne(pSim,vOutputs->pArray[uVar2]);
        iVar1 = vStatus->nSize;
      }
      else if ((vStatus->pArray[lVar3] == '\0') && (vOutputs->pArray[uVar2] == 0)) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x421,"int Gia_ObjHasSameRepr(Gia_Man_t *, int, int)");
      }
      lVar3 = lVar3 + 1;
      uVar2 = uVar2 + 2;
    } while (lVar3 < iVar1);
  }
  return 1;
}

Assistant:

int Gia_ManCheckRefinements( Gia_Man_t * p, Vec_Str_t * vStatus, Vec_Int_t * vOutputs, Cec_ManSim_t * pSim, int fRings )
{
    int i, status, iRepr, iObj;
    int Counter = 0;
    assert( 2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs) );
    Vec_StrForEachEntry( vStatus, status, i )
    {
        iRepr = Vec_IntEntry( vOutputs, 2*i );
        iObj  = Vec_IntEntry( vOutputs, 2*i+1 );
        if ( status == 1 )
            continue;
        if ( status == 0 )
        {
            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
                Counter++;
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Disproved equivalence (%d,%d) is not refined!\n", iRepr, iObj );
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
        if ( status == -1 )
        {
//            if ( !Gia_ObjFailed( p, iObj ) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Failed equivalence is not marked as failed!\n" );
//            Gia_ObjSetFailed( p, iRepr );
//            Gia_ObjSetFailed( p, iObj );        
//            if ( fRings )
//            Cec_ManSimClassRemoveOne( pSim, iRepr );
            Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
    }
//    if ( Counter )
//    Abc_Print( 1, "Gia_ManCheckRefinements(): Could not refine %d nodes.\n", Counter );
    return 1;
}